

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate1<float>::QRotationGate1
          (QRotationGate1<float> *this,int qubit,real_type theta,bool fixed)

{
  float fVar1;
  
  QGate1<float>::QGate1(&this->super_QGate1<float>,qubit);
  (this->super_QGate1<float>).field_0xc = fixed;
  (this->super_QGate1<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_001376d0;
  fVar1 = cosf(theta * 0.5);
  (this->rotation_).angle_.cos_ = fVar1;
  fVar1 = sinf(theta * 0.5);
  (this->rotation_).angle_.sin_ = fVar1;
  return;
}

Assistant:

QRotationGate1( const int qubit , const real_type theta ,
                        const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( theta )
        , QAdjustable( fixed )
        { }